

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Mesh::downsample(Mesh *this)

{
  Selection *unaff_retaddr;
  HalfedgeMesh *in_stack_00000028;
  MeshResampler *in_stack_00000030;
  
  MeshResampler::downsample(in_stack_00000030,in_stack_00000028);
  Selection::clear(unaff_retaddr);
  Selection::clear(unaff_retaddr);
  Selection::clear(unaff_retaddr);
  return;
}

Assistant:

void Mesh::downsample() {
  resampler.downsample(mesh);
  scene->selected.clear();
  scene->hovered.clear();
  scene->elementTransform->target.clear();
}